

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
HashCallback<Blob<128>_>::operator()(HashCallback<Blob<128>_> *this,void *key,int len)

{
  reference this_00;
  undefined4 in_EDX;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_RSI;
  long in_RDI;
  Blob<128> h;
  size_t newsize;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size
            (*(vector<Blob<128>,_std::allocator<Blob<128>_>_> **)(in_RDI + 0x10));
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  Blob<128>::Blob((Blob<128> *)&stack0xffffffffffffffd0);
  (**(code **)(in_RDI + 0x18))(in_RSI,in_EDX,0,&stack0xffffffffffffffd0);
  this_00 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::back(in_stack_ffffffffffffffd0);
  Blob<128>::operator=(this_00,(Blob<128> *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

virtual void operator () ( const void * key, int len )
  {
    size_t newsize = m_hashes.size() + 1;

    m_hashes.resize(newsize);

    hashtype h;
    m_pfHash(key, len, 0, &h);
    m_hashes.back() = h;
  }